

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScalableKReach.cpp
# Opt level: O0

bool __thiscall ScalableKReach::bfs(ScalableKReach *this,vertex_t s,vertex_t t)

{
  value_type vVar1;
  byte bVar2;
  byte bVar3;
  uint v;
  uint uVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  reference puVar8;
  byte *pbVar9;
  bool bVar10;
  ulong local_50;
  size_t i;
  bool result;
  uint *nxt;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  vertex_t cur;
  vertex_t t_local;
  vertex_t s_local;
  ScalableKReach *this_local;
  
  this->back_ = 0;
  this->front_ = 0;
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&this->distance_,(ulong)s)
  ;
  *pvVar6 = '\0';
  sVar5 = this->back_;
  this->back_ = sVar5 + 1;
  pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(&this->queue_,sVar5);
  *pvVar7 = s;
  while( true ) {
    bVar10 = false;
    if (this->back_ != this->front_) {
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         (&this->distance_,(ulong)t);
      bVar10 = *pvVar6 == '?';
    }
    if (!bVar10) break;
    sVar5 = this->front_;
    this->front_ = sVar5 + 1;
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(&this->queue_,sVar5);
    v = *pvVar7;
    pbVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       (&this->distance_,(ulong)v);
    if (*pbVar9 < this->k_) {
      this_00 = Graph::successors(this->graph_,v);
      __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_00);
      nxt = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_00);
      while (bVar10 = __gnu_cxx::operator!=
                                (&__end2,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                          *)&nxt), bVar10) {
        puVar8 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end2);
        pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                           (&this->distance_,(ulong)*puVar8);
        if (((*pvVar6 == '?') && (bVar10 = PartialIndex::indexed(&this->D1_,*puVar8), !bVar10)) &&
           (bVar10 = PartialIndex::indexed(&this->D2_,*puVar8), !bVar10)) {
          pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                             (&this->distance_,(ulong)v);
          vVar1 = *pvVar6;
          pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                             (&this->distance_,(ulong)*puVar8);
          *pvVar6 = vVar1 + '\x01';
          uVar4 = *puVar8;
          sVar5 = this->back_;
          this->back_ = sVar5 + 1;
          pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(&this->queue_,sVar5)
          ;
          *pvVar7 = uVar4;
        }
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end2);
      }
    }
  }
  pbVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&this->distance_,(ulong)t)
  ;
  bVar2 = *pbVar9;
  bVar3 = this->k_;
  for (local_50 = 0; local_50 < this->back_; local_50 = local_50 + 1) {
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(&this->queue_,local_50);
    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       (&this->distance_,(ulong)*pvVar7);
    *pvVar6 = '?';
  }
  return bVar2 <= bVar3;
}

Assistant:

bool ScalableKReach::bfs(vertex_t s, vertex_t t) const {
    back_ = 0;
    front_ = 0;
    distance_.at(s) = 0;
    queue_.at(back_++) = s;
    while (back_ != front_ && distance_.at(t) == INF8) {
        vertex_t cur = queue_.at(front_++);
        if (distance_.at(cur) >= k_) {
            continue;
        }
        for (const auto &nxt : graph_.successors(cur)) {
            if (distance_.at(nxt) == INF8 && !D1_.indexed(nxt) && !D2_.indexed(nxt)) {
                distance_.at(nxt) = distance_.at(cur) + 1;
                queue_.at(back_++) = nxt;
            }
        }
    }
    bool result = distance_.at(t) <= k_;
    for (size_t i = 0; i < back_; ++i) {
        distance_.at(queue_.at(i)) = INF8;
    }
    return result;
}